

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdCheckVar4Dec2(Kit_DsdNtk_t *pNtk0,Kit_DsdNtk_t *pNtk1)

{
  int iVar1;
  Kit_DsdObj_t *pObj0;
  Kit_DsdObj_t *pObj1;
  
  if (pNtk0->nVars != 4) {
    __assert_fail("pNtk0->nVars == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x79f,"int Kit_DsdCheckVar4Dec2(Kit_DsdNtk_t *, Kit_DsdNtk_t *)");
  }
  if (pNtk1->nVars == 4) {
    iVar1 = Kit_DsdFindLargeBox(pNtk0,2);
    if (iVar1 == 0) {
      iVar1 = Kit_DsdFindLargeBox(pNtk1,2);
      if (iVar1 == 0) {
        pObj0 = Kit_DsdNtkRoot(pNtk0);
        pObj1 = Kit_DsdNtkRoot(pNtk1);
        iVar1 = Kit_DsdRootNodeHasCommonVars(pObj0,pObj1);
        return iVar1;
      }
    }
    return 0;
  }
  __assert_fail("pNtk1->nVars == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                ,0x7a0,"int Kit_DsdCheckVar4Dec2(Kit_DsdNtk_t *, Kit_DsdNtk_t *)");
}

Assistant:

int Kit_DsdCheckVar4Dec2( Kit_DsdNtk_t * pNtk0, Kit_DsdNtk_t * pNtk1 )
{
    assert( pNtk0->nVars == 4 );
    assert( pNtk1->nVars == 4 );
    if ( Kit_DsdFindLargeBox(pNtk0, 2) )
        return 0;
    if ( Kit_DsdFindLargeBox(pNtk1, 2) )
        return 0;
    return Kit_DsdRootNodeHasCommonVars( Kit_DsdNtkRoot(pNtk0), Kit_DsdNtkRoot(pNtk1) );
}